

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
* __thiscall
cfd::core::DescriptorNode::GetReferences
          (vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument,DescriptorNode *parent)

{
  uint32_t flags_00;
  size_t sVar1;
  uint32_t derive_child_num;
  bool bVar2;
  DescriptorScriptType DVar3;
  size_type sVar4;
  iterator __first;
  iterator __last;
  reference pvVar5;
  long lVar6;
  unsigned_long uVar7;
  ulong uVar8;
  char *miniscript;
  uchar *script_00;
  undefined8 uVar9;
  const_reference pvVar10;
  iterator __first_00;
  iterator __last_00;
  ScriptBuilder *pSVar11;
  value_type *in_stack_ffffffffffffe088;
  DescriptorScriptReference *in_stack_ffffffffffffe090;
  string *in_stack_ffffffffffffe0a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe0a8;
  CfdError CVar12;
  undefined7 in_stack_ffffffffffffe0b0;
  undefined1 in_stack_ffffffffffffe0b7;
  __type local_1e31;
  Script local_1e08;
  SchnorrPubkey local_1dd0;
  ByteData local_1db8;
  undefined1 local_1d9a;
  allocator local_1d99;
  string local_1d98 [32];
  Script local_1d78;
  undefined1 local_1d3a;
  allocator local_1d39;
  string local_1d38 [38];
  undefined1 local_1d12;
  allocator local_1d11;
  string local_1d10 [32];
  Script local_1cf0;
  undefined1 local_1cb2;
  allocator local_1cb1;
  string local_1cb0 [32];
  Script local_1c90;
  Script local_1c58;
  Script local_1c20;
  undefined1 local_1be8 [8];
  DescriptorScriptReference child_script;
  undefined1 local_1848 [8];
  Pubkey pubkey_1;
  Bip32FormatType local_179c;
  undefined1 local_1798 [4];
  Bip32FormatType bip32_type;
  DescriptorKeyReference ref_2;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  keys_2;
  ByteData local_1468;
  undefined1 local_1450 [8];
  TaprootScriptTree tree;
  undefined1 local_1338 [8];
  TapBranch branch;
  SchnorrPubkey pubkey;
  DescriptorKeyReference ref_1;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  keys_1;
  Script local_f50;
  undefined1 local_f18 [8];
  Script script_1;
  DescriptorScriptReference ref;
  bool local_b39;
  bool has_witness;
  Pubkey local_b28;
  DescriptorKeyReference local_b10;
  ulong local_810;
  size_t index;
  DescriptorKeyReference key_ref;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_> keys
  ;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  undefined1 local_4d0 [4];
  uint32_t reqnum;
  undefined1 local_498 [8];
  Address addr;
  allocator local_2d9;
  string local_2d8 [32];
  CfdSourceLocation local_2b8;
  ByteData local_2a0;
  Script local_288;
  int local_250;
  uint32_t local_24c;
  int ret;
  uint32_t flags;
  size_t written;
  undefined1 local_238 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  string local_218 [32];
  CfdSourceLocation local_1f8;
  size_t local_1e0;
  size_t end_pos;
  string local_1d0 [32];
  CfdSourceLocation local_1b0;
  undefined1 local_198 [8];
  string arg_value;
  string local_170 [38];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [32];
  CfdSourceLocation local_128;
  uint32_t local_10c;
  undefined1 local_108 [4];
  uint32_t child_num;
  ScriptElement elem;
  Script locking_script;
  undefined1 local_60 [8];
  ScriptBuilder build;
  DescriptorNode *parent_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *array_argument_local;
  DescriptorNode *this_local;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *result;
  
  if (((this->depth_ == 0) &&
      (array_argument !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0)) &&
     (sVar4 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(array_argument), 1 < sVar4)) {
    __first = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffe088);
    __last = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffe088);
    ::std::
    reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
  }
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  ::std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::vector(__return_storage_ptr__);
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x433b06);
  Script::Script((Script *)&elem.value_);
  if (this->node_type_ != kDescriptorTypeKey) {
    if (this->node_type_ == kDescriptorTypeNumber) {
      ScriptElement::ScriptElement((ScriptElement *)local_108,(ulong)this->number_);
      ScriptBuilder::AppendElement((ScriptBuilder *)local_60,(ScriptElement *)local_108);
      ScriptElement::~ScriptElement((ScriptElement *)local_108);
    }
    else if (this->node_type_ == kDescriptorTypeScript) {
      if (this->script_type_ == kDescriptorScriptMiniscript) {
        local_10c = 0;
        if (this->need_arg_num_ != 0) {
          if ((array_argument ==
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0) ||
             (bVar2 = ::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty(array_argument), bVar2)) {
            CVar12 = (CfdError)((ulong)in_stack_ffffffffffffe0a8 >> 0x20);
            local_128.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_128.filename = local_128.filename + 1;
            local_128.line = 0x673;
            local_128.funcname = "GetReferences";
            logger::warn<>(&local_128,"Failed to generate miniscript from hdkey.");
            local_14a = 1;
            uVar9 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_148,"Failed to generate miniscript from hdkey.",&local_149);
            CfdException::CfdException
                      ((CfdException *)CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0)
                       ,CVar12,in_stack_ffffffffffffe0a0);
            local_14a = 0;
            __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
          }
          arg_value.field_2._M_local_buf[0xe] = '\0';
          arg_value.field_2._M_local_buf[0xd] = '\0';
          local_1e31 = false;
          if (array_argument !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            bVar2 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty(array_argument);
            local_1e31 = false;
            if (!bVar2) {
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffe090,(size_type)in_stack_ffffffffffffe088);
              ::std::allocator<char>::allocator();
              arg_value.field_2._M_local_buf[0xe] = '\x01';
              ::std::__cxx11::string::string
                        (local_170,"base",(allocator *)(arg_value.field_2._M_local_buf + 0xf));
              arg_value.field_2._M_local_buf[0xd] = '\x01';
              local_1e31 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_ffffffffffffe0b7,
                                                         in_stack_ffffffffffffe0b0),
                                             in_stack_ffffffffffffe0a8);
            }
          }
          if ((arg_value.field_2._M_local_buf[0xd] & 1U) != 0) {
            ::std::__cxx11::string::~string(local_170);
          }
          if ((arg_value.field_2._M_local_buf[0xe] & 1U) != 0) {
            ::std::allocator<char>::~allocator
                      ((allocator<char> *)(arg_value.field_2._M_local_buf + 0xf));
          }
          if ((local_1e31 == false) &&
             (array_argument !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0)) {
            pvVar5 = ::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back(array_argument);
            ::std::__cxx11::string::string((string *)local_198,(string *)pvVar5);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(array_argument);
            lVar6 = ::std::__cxx11::string::rfind(local_198,0x8a930f);
            if (lVar6 != -1) {
              local_1b0.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
              CVar12 = (CfdError)((ulong)in_stack_ffffffffffffe0a8 >> 0x20);
              local_1b0.filename = local_1b0.filename + 1;
              local_1b0.line = 0x680;
              local_1b0.funcname = "GetReferences";
              logger::warn<>(&local_1b0,"Failed to invalid argument. miniscript is single child.");
              end_pos._6_1_ = 1;
              uVar9 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1d0,"Failed to invalid argument. miniscript is single child.",
                         (allocator *)((long)&end_pos + 7));
              CfdException::CfdException
                        ((CfdException *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),CVar12,
                         in_stack_ffffffffffffe0a0);
              end_pos._6_1_ = 0;
              __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
            }
            local_1e0 = 0;
            uVar7 = ::std::__cxx11::stoul((string *)local_198,&local_1e0,10);
            sVar1 = local_1e0;
            local_10c = (uint32_t)uVar7;
            if ((local_1e0 != 0) && (uVar8 = ::std::__cxx11::string::size(), sVar1 < uVar8)) {
              local_1f8.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
              CVar12 = (CfdError)((ulong)in_stack_ffffffffffffe0a8 >> 0x20);
              local_1f8.filename = local_1f8.filename + 1;
              local_1f8.line = 0x689;
              local_1f8.funcname = "GetReferences";
              logger::warn<>(&local_1f8,"Failed to invalid argument. number only.");
              script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
              uVar9 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_218,"Failed to invalid argument. number only.",
                         (allocator *)
                         ((long)&script.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              CfdException::CfdException
                        ((CfdException *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),CVar12,
                         in_stack_ffffffffffffe0a0);
              script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
              __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
            }
            ::std::__cxx11::string::~string((string *)local_198);
          }
        }
        ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x4341cd);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),
                   (size_type)in_stack_ffffffffffffe0a8,(allocator_type *)in_stack_ffffffffffffe0a0)
        ;
        CVar12 = (CfdError)((ulong)in_stack_ffffffffffffe0a8 >> 0x20);
        ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4341f5);
        _ret = 0;
        local_24c = 0;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe090,(char *)in_stack_ffffffffffffe088);
        if (bVar2) {
          local_24c = 1;
        }
        miniscript = (char *)::std::__cxx11::string::c_str();
        derive_child_num = local_10c;
        flags_00 = local_24c;
        script_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4342b4);
        in_stack_ffffffffffffe090 =
             (DescriptorScriptReference *)
             ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
        local_250 = wally_descriptor_parse_miniscript
                              (miniscript,(char **)0x0,(char **)0x0,0,derive_child_num,flags_00,
                               script_00,(size_t)in_stack_ffffffffffffe090,(size_t *)&ret);
        uVar8 = _ret;
        if ((local_250 != 0) ||
           (sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238),
           sVar4 < uVar8)) {
          local_2b8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          local_2b8.filename = local_2b8.filename + 1;
          local_2b8.line = 0x69b;
          local_2b8.funcname = "GetReferences";
          logger::warn<int&,unsigned_long&>
                    (&local_2b8,"Failed to parse miniscript.({}, size:{})",&local_250,
                     (unsigned_long *)&ret);
          uVar9 = __cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_2d8,"Failed to parse miniscript.",&local_2d9);
          CfdException::CfdException
                    ((CfdException *)CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),
                     CVar12,in_stack_ffffffffffffe0a0);
          __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ByteData::ByteData(&local_2a0,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
        Script::Script(&local_288,&local_2a0);
        Script::operator=((Script *)&elem.value_,&local_288);
        Script::~Script((Script *)in_stack_ffffffffffffe090);
        ByteData::~ByteData((ByteData *)0x4343af);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   &this->addr_prefixes_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffe0a0);
      }
      else if (this->script_type_ == kDescriptorScriptRaw) {
        Script::Script((Script *)
                       &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &this->value_);
        Script::operator=((Script *)&elem.value_,
                          (Script *)
                          &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Script::~Script((Script *)in_stack_ffffffffffffe090);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   &this->addr_prefixes_);
      }
      else if (this->script_type_ == kDescriptorScriptAddr) {
        core::Address::Address((Address *)local_498,&this->value_,&this->addr_prefixes_);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Address&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Address *)local_498,&this->addr_prefixes_);
        core::Address::GetLockingScript((Script *)local_4d0,(Address *)local_498);
        Script::operator=((Script *)&elem.value_,(Script *)local_4d0);
        Script::~Script((Script *)in_stack_ffffffffffffe090);
        core::Address::~Address((Address *)in_stack_ffffffffffffe090);
      }
      else if ((this->script_type_ == kDescriptorScriptMulti) ||
              (this->script_type_ == kDescriptorScriptSortedMulti)) {
        pvVar10 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = pvVar10->number_;
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)0x43472a);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)((long)&key_ref.argument_.field_2 + 8));
        DescriptorKeyReference::DescriptorKeyReference((DescriptorKeyReference *)&index);
        for (local_810 = 1; uVar8 = local_810,
            sVar4 = ::std::
                    vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                    size(&this->child_node_), uVar8 < sVar4; local_810 = local_810 + 1) {
          pvVar10 = ::std::
                    vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                    operator[](&this->child_node_,local_810);
          GetKeyReferences(&local_b10,pvVar10,array_argument);
          DescriptorKeyReference::operator=((DescriptorKeyReference *)&index,&local_b10);
          DescriptorKeyReference::~DescriptorKeyReference
                    ((DescriptorKeyReference *)in_stack_ffffffffffffe090);
          ::std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::push_back((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                       *)((long)&key_ref.argument_.field_2 + 8),(value_type *)&index);
          DescriptorKeyReference::GetPubkey(&local_b28,(DescriptorKeyReference *)&index);
          ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::push_back
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                     in_stack_ffffffffffffe090,in_stack_ffffffffffffe088);
          Pubkey::~Pubkey((Pubkey *)0x43481e);
        }
        if (this->script_type_ == kDescriptorScriptSortedMulti) {
          __first_00 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                                 ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                                  in_stack_ffffffffffffe088);
          __last_00 = ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                                 in_stack_ffffffffffffe088);
          ::std::
          sort<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>,bool(*)(cfd::core::Pubkey_const&,cfd::core::Pubkey_const&)>
                    ((__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                      )__first_00._M_current,
                     (__normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
                      )__last_00._M_current,Pubkey::IsLarge);
        }
        local_b39 = false;
        if ((parent != (DescriptorNode *)0x0) &&
           (DVar3 = GetScriptType(parent), DVar3 == kDescriptorScriptWsh)) {
          local_b39 = true;
        }
        ScriptUtil::CreateMultisigRedeemScript
                  ((Script *)
                   &ref.addr_prefixes_.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                   (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   &keys.
                    super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b39);
        Script::operator=((Script *)&elem.value_,
                          (Script *)
                          &ref.addr_prefixes_.
                           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Script::~Script((Script *)in_stack_ffffffffffffe090);
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&,unsigned_int&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)((long)&key_ref.argument_.field_2 + 8),&this->addr_prefixes_,
                   (uint *)((long)&pubkeys.
                                   super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        DescriptorKeyReference::~DescriptorKeyReference
                  ((DescriptorKeyReference *)in_stack_ffffffffffffe090);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffe0a0);
        ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                  ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                   in_stack_ffffffffffffe0a0);
      }
      else if ((this->script_type_ == kDescriptorScriptSh) ||
              (this->script_type_ == kDescriptorScriptWsh)) {
        pvVar10 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        GetReference((DescriptorScriptReference *)
                     &script_1.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar10,array_argument,this
                    );
        DescriptorScriptReference::GetLockingScript
                  ((Script *)local_f18,
                   (DescriptorScriptReference *)
                   &script_1.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (this->script_type_ == kDescriptorScriptWsh) {
          ScriptUtil::CreateP2wshLockingScript(&local_f50,(Script *)local_f18);
          Script::operator=((Script *)&elem.value_,&local_f50);
          Script::~Script((Script *)in_stack_ffffffffffffe090);
        }
        else {
          ScriptUtil::CreateP2shLockingScript
                    ((Script *)
                     &keys_1.
                      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_f18);
          Script::operator=((Script *)&elem.value_,
                            (Script *)
                            &keys_1.
                             super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Script::~Script((Script *)in_stack_ffffffffffffe090);
        }
        ::std::
        vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
        ::
        emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                  ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                    *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                   (DescriptorScriptReference *)
                   &script_1.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->addr_prefixes_);
        Script::~Script((Script *)in_stack_ffffffffffffe090);
        DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffe090);
      }
      else if (this->script_type_ == kDescriptorScriptTaproot) {
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)((long)&ref_1.argument_.field_2 + 8));
        pvVar10 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        GetKeyReferences((DescriptorKeyReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pvVar10,array_argument);
        DescriptorKeyReference::GetSchnorrPubkey
                  ((SchnorrPubkey *)&branch.is_elements_,
                   (DescriptorKeyReference *)
                   &pubkey.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::push_back((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)((long)&ref_1.argument_.field_2 + 8),
                    (value_type *)
                    &pubkey.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        TapBranch::TapBranch((TapBranch *)local_1338,this->network_type_);
        sVar4 = ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                ::size(&this->child_node_);
        if (1 < sVar4) {
          pvVar10 = ::std::
                    vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                    operator[](&this->child_node_,1);
          GetTapBranch((TapBranch *)
                       &tree.nodes_.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar10,array_argument);
          TapBranch::operator=
                    ((TapBranch *)local_1338,
                     (TapBranch *)
                     &tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          TapBranch::~TapBranch((TapBranch *)in_stack_ffffffffffffe090);
        }
        bVar2 = TapBranch::HasTapLeaf((TapBranch *)local_1338);
        if (bVar2) {
          TaprootScriptTree::TaprootScriptTree
                    ((TaprootScriptTree *)local_1450,(TapBranch *)local_1338);
          TaprootUtil::CreateTapScriptControl
                    (&local_1468,(SchnorrPubkey *)&branch.is_elements_,(TapBranch *)local_1450,
                     (SchnorrPubkey *)0x0,(Script *)&elem.value_);
          ByteData::~ByteData((ByteData *)0x434d88);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TaprootScriptTree&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_1.argument_.field_2 + 8),(TaprootScriptTree *)local_1450,
                     &this->addr_prefixes_);
          TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)in_stack_ffffffffffffe090);
        }
        else {
          TaprootUtil::CreateTapScriptControl
                    ((ByteData *)
                     &keys_2.
                      super__Vector_base<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (SchnorrPubkey *)&branch.is_elements_,(TapBranch *)local_1338,
                     (SchnorrPubkey *)0x0,(Script *)&elem.value_);
          ByteData::~ByteData((ByteData *)0x434e24);
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,cfd::core::TapBranch&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_1.argument_.field_2 + 8),(TapBranch *)local_1338,
                     &this->addr_prefixes_);
        }
        TapBranch::~TapBranch((TapBranch *)in_stack_ffffffffffffe090);
        SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x434e79);
        DescriptorKeyReference::~DescriptorKeyReference
                  ((DescriptorKeyReference *)in_stack_ffffffffffffe090);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffe0a0);
      }
      else {
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                  *)((long)&ref_2.argument_.field_2 + 8));
        CVar12 = (CfdError)((ulong)in_stack_ffffffffffffe0a8 >> 0x20);
        pvVar10 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
        GetKeyReferences((DescriptorKeyReference *)local_1798,pvVar10,array_argument);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::push_back((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)((long)&ref_2.argument_.field_2 + 8),(value_type *)local_1798);
        local_179c = kNormal;
        bVar2 = DescriptorKeyReference::HasExtPubkey((DescriptorKeyReference *)local_1798);
        if (bVar2) {
          DescriptorKeyReference::GetExtPubkey
                    ((ExtPubkey *)
                     &pubkey_1.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(DescriptorKeyReference *)local_1798
                    );
          local_179c = Extkey::GetFormatType
                                 ((Extkey *)
                                  &pubkey_1.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ExtPubkey::~ExtPubkey((ExtPubkey *)0x434f78);
        }
        DescriptorKeyReference::GetPubkey((Pubkey *)local_1848,(DescriptorKeyReference *)local_1798)
        ;
        if (this->script_type_ == kDescriptorScriptCombo) {
          bVar2 = Pubkey::IsCompress((Pubkey *)local_1848);
          if (bVar2) {
            if (local_179c != kBip49) {
              ScriptUtil::CreateP2wpkhLockingScript
                        ((Script *)
                         &child_script.addr_prefixes_.
                          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_1848);
              Script::operator=((Script *)&elem.value_,
                                (Script *)
                                &child_script.addr_prefixes_.
                                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Script::~Script((Script *)in_stack_ffffffffffffe090);
              ::std::
              vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
              ::
              emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                        ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                          *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                         (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                          *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
            }
            if (local_179c != kBip84) {
              DescriptorScriptReference::DescriptorScriptReference
                        ((DescriptorScriptReference *)local_1be8,(Script *)&elem.value_,
                         kDescriptorScriptWpkh,
                         (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                          *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_,0);
              ScriptUtil::CreateP2shLockingScript(&local_1c20,(Script *)&elem.value_);
              Script::operator=((Script *)&elem.value_,&local_1c20);
              Script::~Script((Script *)in_stack_ffffffffffffe090);
              ::std::
              vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
              ::
              emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,cfd::core::DescriptorScriptReference&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                        ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                          *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                         (DescriptorScriptReference *)local_1be8,&this->addr_prefixes_);
              DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffe090);
            }
          }
          if (local_179c == kNormal) {
            ScriptUtil::CreateP2pkhLockingScript(&local_1c58,(Pubkey *)local_1848);
            Script::operator=((Script *)&elem.value_,&local_1c58);
            Script::~Script((Script *)in_stack_ffffffffffffe090);
            ::std::
            vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
            ::
            emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                      ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                        *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                       (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
            pSVar11 = ScriptBuilder::operator<<((ScriptBuilder *)local_60,(Pubkey *)local_1848);
            ScriptBuilder::operator<<(pSVar11,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
            ScriptBuilder::Build(&local_1c90,(ScriptBuilder *)local_60);
            Script::operator=((Script *)&elem.value_,&local_1c90);
            Script::~Script((Script *)in_stack_ffffffffffffe090);
            ::std::
            vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
            ::
            emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                      ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                        *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                       (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
          }
        }
        else {
          if (this->script_type_ == kDescriptorScriptPkh) {
            if (local_179c != kNormal) {
              local_1cb2 = 1;
              uVar9 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1cb0,"invalid bip32 format. pkh is not using bip49 or bip84.",
                         &local_1cb1);
              CfdException::CfdException
                        ((CfdException *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),CVar12,
                         in_stack_ffffffffffffe0a0);
              local_1cb2 = 0;
              __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
            }
            ScriptUtil::CreateP2pkhLockingScript(&local_1cf0,(Pubkey *)local_1848);
            Script::operator=((Script *)&elem.value_,&local_1cf0);
            Script::~Script((Script *)in_stack_ffffffffffffe090);
          }
          else if (this->script_type_ == kDescriptorScriptWpkh) {
            if ((local_179c == kBip49) &&
               ((parent == (DescriptorNode *)0x0 ||
                (DVar3 = GetScriptType(parent), DVar3 != kDescriptorScriptSh)))) {
              local_1d12 = 1;
              uVar9 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1d10,"invalid bip32 format. bip49 is using sh-wpkh only.",&local_1d11
                        );
              CfdException::CfdException
                        ((CfdException *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),CVar12,
                         in_stack_ffffffffffffe0a0);
              local_1d12 = 0;
              __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
            }
            if ((local_179c == kBip84) && (parent != (DescriptorNode *)0x0)) {
              local_1d3a = 1;
              uVar9 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1d38,"invalid bip32 format. bip84 is using wpkh only.",&local_1d39);
              CfdException::CfdException
                        ((CfdException *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),CVar12,
                         in_stack_ffffffffffffe0a0);
              local_1d3a = 0;
              __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
            }
            ScriptUtil::CreateP2wpkhLockingScript(&local_1d78,(Pubkey *)local_1848);
            Script::operator=((Script *)&elem.value_,&local_1d78);
            Script::~Script((Script *)in_stack_ffffffffffffe090);
          }
          else if (this->script_type_ == kDescriptorScriptPk) {
            if (local_179c != kNormal) {
              local_1d9a = 1;
              uVar9 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1d98,"invalid bip32 format. pk is not using bip49 or bip84.",
                         &local_1d99);
              CfdException::CfdException
                        ((CfdException *)
                         CONCAT17(in_stack_ffffffffffffe0b7,in_stack_ffffffffffffe0b0),CVar12,
                         in_stack_ffffffffffffe0a0);
              local_1d9a = 0;
              __cxa_throw(uVar9,&CfdException::typeinfo,CfdException::~CfdException);
            }
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffe090,(char *)in_stack_ffffffffffffe088
                                     );
            if (bVar2) {
              SchnorrPubkey::FromPubkey(&local_1dd0,(Pubkey *)local_1848,(bool *)0x0);
              SchnorrPubkey::GetData(&local_1db8,&local_1dd0);
              pSVar11 = ScriptBuilder::operator<<((ScriptBuilder *)local_60,&local_1db8);
              ScriptBuilder::operator<<(pSVar11,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
              ByteData::~ByteData((ByteData *)0x43582a);
              SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x435836);
            }
            else {
              in_stack_ffffffffffffe0a0 =
                   (string *)
                   ScriptBuilder::operator<<((ScriptBuilder *)local_60,(Pubkey *)local_1848);
              ScriptBuilder::operator<<
                        ((ScriptBuilder *)in_stack_ffffffffffffe0a0,
                         (ScriptOperator *)ScriptOperator::OP_CHECKSIG);
            }
            ScriptBuilder::Build(&local_1e08,(ScriptBuilder *)local_60);
            Script::operator=((Script *)&elem.value_,&local_1e08);
            Script::~Script((Script *)in_stack_ffffffffffffe090);
          }
          ::std::
          vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
          ::
          emplace_back<cfd::core::Script&,cfd::core::DescriptorScriptType_const&,std::vector<cfd::core::DescriptorKeyReference,std::allocator<cfd::core::DescriptorKeyReference>>&,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                    ((vector<cfd::core::DescriptorScriptReference,std::allocator<cfd::core::DescriptorScriptReference>>
                      *)__return_storage_ptr__,(Script *)&elem.value_,&this->script_type_,
                     (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                      *)((long)&ref_2.argument_.field_2 + 8),&this->addr_prefixes_);
        }
        Pubkey::~Pubkey((Pubkey *)0x435934);
        DescriptorKeyReference::~DescriptorKeyReference
                  ((DescriptorKeyReference *)in_stack_ffffffffffffe090);
        ::std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffe0a0);
      }
    }
  }
  build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  Script::~Script((Script *)in_stack_ffffffffffffe090);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x43599f);
  if ((build.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    ::std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DescriptorScriptReference> DescriptorNode::GetReferences(
    std::vector<std::string>* array_argument,
    const DescriptorNode* parent) const {
  if ((depth_ == 0) && (array_argument) && (array_argument->size() > 1)) {
    std::reverse(array_argument->begin(), array_argument->end());
  }
  std::vector<DescriptorScriptReference> result;
  ScriptBuilder build;
  Script locking_script;

  if (node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
    // do nothing
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
    ScriptElement elem(static_cast<int64_t>(number_));
    build.AppendElement(elem);
  } else if (node_type_ == DescriptorNodeType::kDescriptorTypeScript) {
    if (script_type_ == DescriptorScriptType::kDescriptorScriptMiniscript) {
      uint32_t child_num = 0;
      if (need_arg_num_ == 0) {
        // do nothing
      } else if ((array_argument == nullptr) || array_argument->empty()) {
        warn(CFD_LOG_SOURCE, "Failed to generate miniscript from hdkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to generate miniscript from hdkey.");
      } else if (
          (array_argument != nullptr) && (!array_argument->empty()) &&
          (array_argument->at(0) == std::string(kArgumentBaseExtkey))) {
        // do nothing
      } else if (array_argument != nullptr) {
        std::string arg_value = array_argument->back();
        array_argument->pop_back();
        if (arg_value.rfind("/") != std::string::npos) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to invalid argument. miniscript is single child.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. miniscript is single child.");
        }
        std::size_t end_pos = 0;
        child_num = static_cast<uint32_t>(std::stoul(arg_value, &end_pos, 10));
        if ((end_pos != 0) && (end_pos < arg_value.size())) {
          warn(CFD_LOG_SOURCE, "Failed to invalid argument. number only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to invalid argument. number only.");
        }
      }
      std::vector<uint8_t> script(number_);
      size_t written = 0;
      uint32_t flags = 0;
      if (parent_kind_ == "tr") flags = WALLY_MINISCRIPT_TAPSCRIPT;
      int ret = wally_descriptor_parse_miniscript(
          value_.c_str(), nullptr, nullptr, 0, child_num, flags, script.data(),
          script.size(), &written);
      if ((ret == WALLY_OK) && (written <= script.size())) {
        locking_script = Script(script);
        result.emplace_back(locking_script, script_type_, addr_prefixes_);
      } else {
        warn(
            CFD_LOG_SOURCE, "Failed to parse miniscript.({}, size:{})", ret,
            written);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Failed to parse miniscript.");
      }
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptRaw) {
      locking_script = Script(value_);
      result.emplace_back(locking_script, script_type_, addr_prefixes_);
    } else if (script_type_ == DescriptorScriptType::kDescriptorScriptAddr) {
      Address addr(value_, addr_prefixes_);
      result.emplace_back(addr, addr_prefixes_);
      locking_script = addr.GetLockingScript();
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptMulti) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti)) {
      uint32_t reqnum = child_node_[0].number_;
      std::vector<Pubkey> pubkeys;
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference key_ref;
      for (size_t index = 1; index < child_node_.size(); ++index) {
        key_ref = child_node_[index].GetKeyReferences(array_argument);
        keys.push_back(key_ref);
        pubkeys.push_back(key_ref.GetPubkey());
      }
      if (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti) {
        // https://github.com/bitcoin/bips/blob/master/bip-0067.mediawiki
        std::sort(pubkeys.begin(), pubkeys.end(), Pubkey::IsLarge);
      }
      bool has_witness = false;
      if ((parent != nullptr) &&
          (parent->GetScriptType() ==
           DescriptorScriptType::kDescriptorScriptWsh)) {
        has_witness = true;
      }
      locking_script =
          ScriptUtil::CreateMultisigRedeemScript(reqnum, pubkeys, has_witness);
      result.emplace_back(
          locking_script, script_type_, keys, addr_prefixes_, reqnum);
    } else if (
        (script_type_ == DescriptorScriptType::kDescriptorScriptSh) ||
        (script_type_ == DescriptorScriptType::kDescriptorScriptWsh)) {
      DescriptorScriptReference ref =
          child_node_[0].GetReference(array_argument, this);
      Script script = ref.GetLockingScript();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
        locking_script = ScriptUtil::CreateP2wshLockingScript(script);
      } else {
        locking_script = ScriptUtil::CreateP2shLockingScript(script);
      }
      result.emplace_back(locking_script, script_type_, ref, addr_prefixes_);
    } else if (
        script_type_ == DescriptorScriptType::kDescriptorScriptTaproot) {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      SchnorrPubkey pubkey = ref.GetSchnorrPubkey();
      keys.push_back(ref);
      TapBranch branch(network_type_);
      if (child_node_.size() >= 2) {
        branch = child_node_[1].GetTapBranch(array_argument);
      }
      if (branch.HasTapLeaf()) {
        TaprootScriptTree tree(branch);
        TaprootUtil::CreateTapScriptControl(
            pubkey, tree, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, tree, addr_prefixes_);
      } else {
        // see: https://github.com/bitcoin/bips/blob/master/bip-0086.mediawiki
        // see: https://github.com/bitcoin/bips/blob/master/bip-0341.mediawiki#cite_note-22 // NOLINT
        TaprootUtil::CreateTapScriptControl(
            pubkey, branch, nullptr, &locking_script);
        result.emplace_back(
            locking_script, script_type_, keys, branch, addr_prefixes_);
      }
    } else {
      std::vector<DescriptorKeyReference> keys;
      DescriptorKeyReference ref =
          child_node_[0].GetKeyReferences(array_argument);
      keys.push_back(ref);
      Bip32FormatType bip32_type = Bip32FormatType::kNormal;
      if (ref.HasExtPubkey()) {
        bip32_type = ref.GetExtPubkey().GetFormatType();
      }
      Pubkey pubkey = ref.GetPubkey();
      if (script_type_ == DescriptorScriptType::kDescriptorScriptCombo) {
        if (pubkey.IsCompress()) {
          if (bip32_type != Bip32FormatType::kBip49) {
            // p2wpkh
            locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
            result.emplace_back(
                locking_script, script_type_, keys, addr_prefixes_);
          }

          if (bip32_type != Bip32FormatType::kBip84) {
            // p2sh-p2wpkh
            DescriptorScriptReference child_script(
                locking_script, DescriptorScriptType::kDescriptorScriptWpkh,
                keys, addr_prefixes_);
            locking_script =
                ScriptUtil::CreateP2shLockingScript(locking_script);
            result.emplace_back(
                locking_script, script_type_, child_script, addr_prefixes_);
          }
        }

        if (bip32_type == Bip32FormatType::kNormal) {
          // p2pkh
          locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
          result.emplace_back(
              locking_script, script_type_, keys, addr_prefixes_);

          // p2pk
          build << pubkey << ScriptOperator::OP_CHECKSIG;
          locking_script = build.Build();
          result.emplace_back(
              locking_script, script_type_, keys, addr_prefixes_);
        }
      } else {
        if (script_type_ == DescriptorScriptType::kDescriptorScriptPkh) {
          if (bip32_type != Bip32FormatType::kNormal) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. pkh is not using bip49 or bip84.");
          }
          locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
        } else if (
            script_type_ == DescriptorScriptType::kDescriptorScriptWpkh) {
          if ((bip32_type == Bip32FormatType::kBip49) &&
              ((parent == nullptr) ||
               (parent->GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptSh))) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. bip49 is using sh-wpkh only.");
          } else if (
              (bip32_type == Bip32FormatType::kBip84) && (parent != nullptr)) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. bip84 is using wpkh only.");
          }
          locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
        } else if (script_type_ == DescriptorScriptType::kDescriptorScriptPk) {
          if (bip32_type != Bip32FormatType::kNormal) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "invalid bip32 format. pk is not using bip49 or bip84.");
          }
          if (parent_kind_ == "tr") {
            build << SchnorrPubkey::FromPubkey(pubkey).GetData()
                  << ScriptOperator::OP_CHECKSIG;
          } else {
            build << pubkey << ScriptOperator::OP_CHECKSIG;
          }
          locking_script = build.Build();
        }
        result.emplace_back(
            locking_script, script_type_, keys, addr_prefixes_);
      }
    }
  } else {
    // do nothing
  }

  return result;
}